

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::SetNextPlotLimitsX(double x_min,double x_max,ImGuiCond cond)

{
  ImPlotContext *pIVar1;
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot == __null) && \"SetNextPlotLSetNextPlotLimitsXimitsY() needs to be called before BeginPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x9ff,"void ImPlot::SetNextPlotLimitsX(double, double, ImGuiCond)");
  }
  if ((cond & cond - 1U) == 0) {
    (GImPlot->NextPlotData).HasXRange = true;
    (pIVar1->NextPlotData).XRangeCond = cond;
    (pIVar1->NextPlotData).XRange.Min = x_min;
    (pIVar1->NextPlotData).XRange.Max = x_max;
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa00,"void ImPlot::SetNextPlotLimitsX(double, double, ImGuiCond)");
}

Assistant:

void SetNextPlotLimitsX(double x_min, double x_max, ImGuiCond cond) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot == NULL, "SetNextPlotLSetNextPlotLimitsXimitsY() needs to be called before BeginPlot()!");
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    gp.NextPlotData.HasXRange = true;
    gp.NextPlotData.XRangeCond = cond;
    gp.NextPlotData.XRange.Min = x_min;
    gp.NextPlotData.XRange.Max = x_max;
}